

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt_test.c
# Opt level: O0

bool_t mtTest(void)

{
  bool_t bVar1;
  size_t sVar2;
  size_t ctr [1];
  mt_mtx_t mtx [1];
  _func_void_varargs *in_stack_ffffffffffffffb8;
  size_t *in_stack_ffffffffffffffc0;
  bool_t local_4;
  
  memset(&stack0xffffffffffffffc0,0,8);
  bVar1 = mtMtxCreate((mt_mtx_t *)0x10551f);
  if (bVar1 == 0) {
    local_4 = 0;
  }
  else {
    mtMtxLock((mt_mtx_t *)0x10553b);
    mtMtxUnlock((mt_mtx_t *)0x105545);
    mtMtxClose((mt_mtx_t *)0x10554f);
    mtAtomicIncr((size_t *)&stack0xffffffffffffffc0);
    mtAtomicIncr((size_t *)&stack0xffffffffffffffc0);
    mtAtomicDecr((size_t *)&stack0xffffffffffffffc0);
    sVar2 = mtAtomicCmpSwap((size_t *)&stack0xffffffffffffffc0,1,0);
    if ((sVar2 == 1) && (in_stack_ffffffffffffffc0 == (size_t *)0x0)) {
      bVar1 = mtCallOnce((size_t *)0x0,in_stack_ffffffffffffffb8);
      if ((bVar1 == 0) || (_inited == 0)) {
        local_4 = 0;
      }
      else {
        bVar1 = mtCallOnce(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        if ((bVar1 == 0) || (_inited == 0)) {
          local_4 = 0;
        }
        else {
          local_4 = 1;
        }
      }
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

bool_t mtTest()
{
	mt_mtx_t mtx[1];
	size_t ctr[1] = { SIZE_0 };
	// мьютексы
	if (!mtMtxCreate(mtx))
		return FALSE;
	mtMtxLock(mtx);
	mtMtxUnlock(mtx);
	mtMtxClose(mtx);
	// атомарные операции
	mtAtomicIncr(ctr);
	mtAtomicIncr(ctr);
	mtAtomicDecr(ctr);
	if (mtAtomicCmpSwap(ctr, 1, 0) != 1 || *ctr != SIZE_0)
		return FALSE;
	// однократный вызов
	if (!mtCallOnce(&_once, init) || !_inited)
		return FALSE;
	if (!mtCallOnce(&_once, init) || !_inited)
		return FALSE;
	// все нормально
	return TRUE;
}